

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O2

void getRGB(Image *image,vector<unsigned_char,_std::allocator<unsigned_char>_> *data,bool isSwitch)

{
  pointer __dest;
  long lVar1;
  size_t __n;
  
  __dest = (image->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_start;
  __n = (size_t)((image->size).width << 2);
  memcpy(__dest,(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start,__n);
  for (lVar1 = 0;
      __n + lVar1 <
      (ulong)((long)(image->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(image->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                   super__Vector_impl_data._M_start); lVar1 = lVar1 + 1) {
    (&__dest->r)[lVar1 + __n] =
         (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start[lVar1 + __n] + (&__dest->r)[lVar1];
  }
  if (isSwitch) {
    return;
  }
  swapBR(image);
  return;
}

Assistant:

void getRGB(Image &image, const std::vector<uint8_t> &data, bool isSwitch) {
	int scanline = sizeof(Color) * image.size.width;
	uint8_t *start = (uint8_t *)image.colorData.data();
	memcpy(start, data.data(), scanline);
	for (int i = scanline; i < sizeof(Color) * image.colorData.size(); i++) {
		start[i] = start[i - scanline] + data[i];
	}
	if (!isSwitch) { swapBR(image); }
}